

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O2

uint32_t OPENSSL_hash32(void *ptr,size_t len)

{
  uint32_t h;
  size_t i;
  size_t sVar1;
  
  h = 0x811c9dc5;
  for (sVar1 = 0; len != sVar1; sVar1 = sVar1 + 1) {
    h = (h ^ *(byte *)((long)ptr + sVar1)) * 0x1000193;
  }
  return h;
}

Assistant:

uint32_t OPENSSL_hash32(const void *ptr, size_t len) {
  // These are the FNV-1a parameters for 32 bits.
  static const uint32_t kPrime = 16777619u;
  static const uint32_t kOffsetBasis = 2166136261u;

  const uint8_t *in = reinterpret_cast<const uint8_t *>(ptr);
  uint32_t h = kOffsetBasis;

  for (size_t i = 0; i < len; i++) {
    h ^= in[i];
    h *= kPrime;
  }

  return h;
}